

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

int __thiscall QHeaderView::sectionViewportPosition(QHeaderView *this,int logicalIndex)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  LayoutDirection LVar5;
  int iVar6;
  
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  iVar3 = count(this);
  iVar4 = -1;
  if (logicalIndex < iVar3) {
    iVar4 = sectionPosition(this,logicalIndex);
    if ((-1 < iVar4) && (iVar4 = iVar4 - *(int *)(lVar2 + 0x544), *(int *)(lVar2 + 0x548) == 1)) {
      LVar5 = QWidget::layoutDirection(*(QWidget **)(lVar2 + 8));
      if (LVar5 == RightToLeft) {
        lVar2 = *(long *)(*(long *)(lVar2 + 0x2b0) + 0x20);
        iVar3 = *(int *)(lVar2 + 0x1c);
        iVar1 = *(int *)(lVar2 + 0x14);
        iVar6 = sectionSize(this,logicalIndex);
        iVar4 = (iVar3 - (iVar6 + iVar4 + iVar1)) + 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int QHeaderView::sectionViewportPosition(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (logicalIndex >= count())
        return -1;
    int position = sectionPosition(logicalIndex);
    if (position < 0)
        return position; // the section was hidden
    int offsetPosition = position - d->headerOffset;
    if (d->reverse())
        return d->viewport->width() - (offsetPosition + sectionSize(logicalIndex));
    return offsetPosition;
}